

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

uint32_t find_switch_node(log_multi *b)

{
  uint uVar1;
  node *pnVar2;
  long in_RDI;
  uint32_t node;
  uint local_c;
  
  local_c = 0;
  while (pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_c),
        (pnVar2->internal & 1U) != 0) {
    pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_c);
    pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)pnVar2->left);
    uVar1 = pnVar2->min_count;
    pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_c);
    pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)pnVar2->right);
    if (uVar1 < pnVar2->min_count) {
      pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_c);
      local_c = pnVar2->left;
    }
    else {
      pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)local_c);
      local_c = pnVar2->right;
    }
  }
  return local_c;
}

Assistant:

inline uint32_t find_switch_node(log_multi& b)
{
  uint32_t node = 0;
  while (b.nodes[node].internal)
    if (b.nodes[b.nodes[node].left].min_count < b.nodes[b.nodes[node].right].min_count)
      node = b.nodes[node].left;
    else
      node = b.nodes[node].right;
  return node;
}